

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O1

void __thiscall
TEST_MockSupport_c_outputParametersOfType_Test::testBody
          (TEST_MockSupport_c_outputParametersOfType_Test *this)

{
  MockSupport_c *pMVar1;
  MockExpectedCall_c *pMVar2;
  MockActualCall_c *pMVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  long lVar6;
  int retval;
  int param;
  undefined4 local_30;
  int local_2c;
  
  local_2c = 1;
  local_30 = 2;
  pMVar1 = mock_c();
  (*pMVar1->installCopier)("typeName",typeCopy);
  pMVar1 = mock_c();
  pMVar2 = (*pMVar1->expectOneCall)("foo");
  (*pMVar2->withOutputParameterOfTypeReturning)("typeName","out",&local_30);
  pMVar1 = mock_c();
  pMVar3 = (*pMVar1->actualCall)("foo");
  (*pMVar3->withOutputParameterOfType)("typeName","out",&local_2c);
  pUVar4 = UtestShell::getCurrent();
  lVar6 = (long)local_2c;
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,2,lVar6,"LONGS_EQUAL(2, param) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
             ,0xe5,pTVar5);
  pUVar4 = UtestShell::getCurrent();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,2,2,"LONGS_EQUAL(2, retval) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
             ,0xe6,pTVar5);
  pMVar1 = mock_c();
  (*pMVar1->checkExpectations)();
  pMVar1 = mock_c();
  (*pMVar1->removeAllComparatorsAndCopiers)();
  return;
}

Assistant:

TEST(MockSupport_c, outputParametersOfType)
{
    int param = 1;
    const int retval = 2;
    mock_c()->installCopier("typeName", typeCopy);
    mock_c()->expectOneCall("foo")->withOutputParameterOfTypeReturning("typeName", "out", &retval);
    mock_c()->actualCall("foo")->withOutputParameterOfType("typeName", "out", &param);
    LONGS_EQUAL(2, param);
    LONGS_EQUAL(2, retval);
    mock_c()->checkExpectations();
    mock_c()->removeAllComparatorsAndCopiers();
}